

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,_ *param_2,int *param_3,undefined8 param_4,
                         CappedArray<char,_14UL> *param_5)

{
  _ local_39;
  CappedArray<char,_14UL> local_38;
  
  local_39 = *param_2;
  toCharSequence<int&>(&local_38,(kj *)(param_2 + 4),param_3);
  concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,&local_39,(FixedArray<char,_1UL> *)(param_2 + 8),
             (StringPtr *)&local_38,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}